

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall
slang::ast::Compilation::checkBindTargetParams
          (Compilation *this,BindDirectiveSyntax *syntax,Scope *scope,ResolvedBind *resolvedBind)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  pointer ppSVar3;
  size_type sVar4;
  DefinitionSymbol *pDVar5;
  value_type_pointer ppVar6;
  ulong uVar7;
  undefined8 *puVar8;
  int iVar9;
  undefined1 auVar10 [16];
  byte bVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  SmallVector<const_slang::ast::Symbol_*,_5UL> *__range2;
  undefined8 *puVar17;
  ulong uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  byte bVar22;
  undefined1 auVar23 [16];
  anon_class_16_2_6b548e5c doCheck;
  anon_class_16_2_6b548e5c local_40;
  
  ppSVar3 = (resolvedBind->instTargets).super_SmallVectorBase<const_slang::ast::Symbol_*>.data_;
  sVar4 = (resolvedBind->instTargets).super_SmallVectorBase<const_slang::ast::Symbol_*>.len;
  local_40.syntax = syntax;
  local_40.scope = scope;
  for (lVar15 = 0; sVar4 << 3 != lVar15; lVar15 = lVar15 + 8) {
    checkBindTargetParams::anon_class_16_2_6b548e5c::operator()
              (&local_40,*(InstanceBodySymbol **)(*(long *)((long)ppSVar3 + lVar15) + 0x50));
  }
  pDVar5 = resolvedBind->defTarget;
  if (pDVar5 != (DefinitionSymbol *)0x0) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = pDVar5;
    uVar13 = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar12 = uVar13 >> ((byte)(this->instancesWithDefBinds).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
                              .arrays.groups_size_index & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar13 & 0xff];
    ppVar6 = (this->instancesWithDefBinds).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
             .arrays.elements_;
    uVar7 = (this->instancesWithDefBinds).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
            .arrays.groups_size_mask;
    uVar16 = 0;
    do {
      pgVar1 = (this->instancesWithDefBinds).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
               .arrays.groups_ + uVar12;
      bVar11 = pgVar1->m[0xf].n;
      uVar19 = (uchar)uVar2;
      auVar23[0] = -(pgVar1->m[0].n == uVar19);
      uVar20 = (uchar)((uint)uVar2 >> 8);
      auVar23[1] = -(pgVar1->m[1].n == uVar20);
      uVar21 = (uchar)((uint)uVar2 >> 0x10);
      auVar23[2] = -(pgVar1->m[2].n == uVar21);
      bVar22 = (byte)((uint)uVar2 >> 0x18);
      auVar23[3] = -(pgVar1->m[3].n == bVar22);
      auVar23[4] = -(pgVar1->m[4].n == uVar19);
      auVar23[5] = -(pgVar1->m[5].n == uVar20);
      auVar23[6] = -(pgVar1->m[6].n == uVar21);
      auVar23[7] = -(pgVar1->m[7].n == bVar22);
      auVar23[8] = -(pgVar1->m[8].n == uVar19);
      auVar23[9] = -(pgVar1->m[9].n == uVar20);
      auVar23[10] = -(pgVar1->m[10].n == uVar21);
      auVar23[0xb] = -(pgVar1->m[0xb].n == bVar22);
      auVar23[0xc] = -(pgVar1->m[0xc].n == uVar19);
      auVar23[0xd] = -(pgVar1->m[0xd].n == uVar20);
      auVar23[0xe] = -(pgVar1->m[0xe].n == uVar21);
      auVar23[0xf] = -(bVar11 == bVar22);
      for (uVar14 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe); uVar14 != 0;
          uVar14 = uVar14 - 1 & uVar14) {
        iVar9 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
          }
        }
        uVar18 = (ulong)(uint)(iVar9 << 5);
        if (pDVar5 == *(DefinitionSymbol **)((long)&ppVar6[uVar12 * 0xf].first + uVar18)) {
          puVar8 = *(undefined8 **)
                    ((long)&ppVar6[uVar12 * 0xf].second.
                            super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish + uVar18);
          for (puVar17 = *(undefined8 **)
                          ((long)&ppVar6[uVar12 * 0xf].second.
                                  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar18);
              puVar17 != puVar8; puVar17 = puVar17 + 1) {
            checkBindTargetParams::anon_class_16_2_6b548e5c::operator()
                      (&local_40,(InstanceBodySymbol *)*puVar17);
          }
          return;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7] & bVar11) == 0) {
        return;
      }
      lVar15 = uVar12 + uVar16;
      uVar16 = uVar16 + 1;
      uVar12 = lVar15 + 1U & uVar7;
    } while (uVar16 <= uVar7);
  }
  return;
}

Assistant:

void Compilation::checkBindTargetParams(const syntax::BindDirectiveSyntax& syntax,
                                        const Scope& scope, const ResolvedBind& resolvedBind) {
    // This method checks the following rule from the LRM:
    //    User-defined type names that are used to override type parameters must be
    //    visible and matching in both the scope containing the bind statement and in
    //    the target scope.
    auto doCheck = [&](const InstanceBodySymbol& container) {
        if (syntax.instantiation->kind == SyntaxKind::CheckerInstantiation)
            return;

        for (auto instSyntax : syntax.instantiation->as<HierarchyInstantiationSyntax>().instances) {
            if (!instSyntax->decl)
                continue;

            auto sym = container.find(instSyntax->decl->name.valueText());
            if (!sym || sym->kind != SymbolKind::Instance || sym->getSyntax() != instSyntax)
                continue;

            auto& inst = sym->as<InstanceSymbol>();
            for (auto param : inst.body.getParameters()) {
                if (param->symbol.kind == SymbolKind::TypeParameter) {
                    auto& typeParam = param->symbol.as<TypeParameterSymbol>();
                    auto& type = typeParam.targetType.getType();
                    if (typeParam.isOverridden() && type.isAlias() && !type.name.empty()) {
                        // This is the case we need to check; the resolved type is
                        // a named type alias, so we need to also resolve it in the bind
                        // directive scope and make sure they match.
                        auto result = Lookup::unqualified(scope, type.name, LookupFlags::Type);
                        if (!result || !result->isType()) {
                            auto ts = typeParam.getDeclaredType()->getTypeSyntax();
                            SLANG_ASSERT(ts);
                            scope.addDiag(diag::BindTypeParamNotFound, ts->sourceRange())
                                << typeParam.name << type;
                        }
                        else if (!result->as<Type>().isMatching(type)) {
                            auto ts = typeParam.getDeclaredType()->getTypeSyntax();
                            SLANG_ASSERT(ts);
                            scope.addDiag(diag::BindTypeParamMismatch, ts->sourceRange())
                                << typeParam.name << result->as<Type>() << type;
                        }
                    }
                }
            }
        }
    };

    for (auto target : resolvedBind.instTargets)
        doCheck(target->as<InstanceSymbol>().body);

    if (resolvedBind.defTarget) {
        auto it = instancesWithDefBinds.find(resolvedBind.defTarget);
        if (it != instancesWithDefBinds.end()) {
            for (auto target : it->second)
                doCheck(target->as<InstanceBodySymbol>());
        }
    }
}